

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

bool operator!=(Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<_17>,_Detail::M3<_28>,_Detail::M3<_1>,_Detail::NoTempering>
                *lhs,Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<_17>,_Detail::M3<_28>,_Detail::M3<_1>,_Detail::NoTempering>
                     *rhs)

{
  bool bVar1;
  
  bVar1 = operator==(lhs,rhs);
  return !bVar1;
}

Assistant:

bool operator!=(const Well& lhs, const Well& rhs)
    {
        return !(lhs == rhs);
    }